

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
pstore::broker::command_processor::echo
          (command_processor *this,fifo_path *param_1,broker_command *c)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)iomut);
  if (iVar1 == 0) {
    printf("ECHO:%s\n",(c->path)._M_dataplus._M_p);
    pthread_mutex_unlock((pthread_mutex_t *)iomut);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void command_processor::echo (brokerface::fifo_path const &, broker_command const & c) {
            std::lock_guard<decltype (iomut)> lock{iomut};
            std::printf ("ECHO:%s\n", c.path.c_str ());
        }